

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O0

Cut_Cut_t * Cut_CutTriv(Cut_Oracle_t *p,int Node)

{
  Cut_Cut_t *p_00;
  uint *puVar1;
  int local_2c;
  int i;
  uint *pTruth;
  Cut_Cut_t *pCut;
  int Node_local;
  Cut_Oracle_t *p_local;
  
  p_00 = Cut_CutStart(p);
  *(uint *)p_00 = *(uint *)p_00 & 0xfffffff | 0x10000000;
  *(int *)(p_00 + 1) = Node;
  if (p->pParams->fTruth != 0) {
    puVar1 = Cut_CutReadTruth(p_00);
    for (local_2c = 0; local_2c < p->nTruthWords; local_2c = local_2c + 1) {
      puVar1[local_2c] = 0xaaaaaaaa;
    }
  }
  p->nCutsTriv = p->nCutsTriv + 1;
  return p_00;
}

Assistant:

Cut_Cut_t * Cut_CutTriv( Cut_Oracle_t * p, int Node )
{
    Cut_Cut_t * pCut;
    pCut = Cut_CutStart( p );
    pCut->nLeaves    = 1;
    pCut->pLeaves[0] = Node;
    if ( p->pParams->fTruth )
    {
        unsigned * pTruth = Cut_CutReadTruth(pCut);
        int i;
        for ( i = 0; i < p->nTruthWords; i++ )
            pTruth[i] = 0xAAAAAAAA;
    }
    p->nCutsTriv++;
    return pCut;
}